

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlWriter::ensureTagClosed(XmlWriter *this)

{
  char local_a [2];
  
  if (this->m_tagIsOpen == true) {
    local_a[0] = '>';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_os,local_a,1);
    std::ostream::flush();
    if (this->m_needsNewline == true) {
      local_a[1] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_os,local_a + 1,1);
      this->m_needsNewline = false;
    }
    this->m_tagIsOpen = false;
  }
  return;
}

Assistant:

void XmlWriter::ensureTagClosed() {
        if( m_tagIsOpen ) {
            m_os << '>' << std::flush;
            newlineIfNecessary();
            m_tagIsOpen = false;
        }
    }